

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O3

double icu_63::double_conversion::RadixStringToIeee<3,char*>
                 (char **current,char *end,bool sign,bool allow_trailing_junk,
                 double junk_string_value,bool read_as_double,bool *result_is_junk)

{
  char cVar1;
  sbyte sVar2;
  double dVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  DiyFp diy_fp;
  
  *result_is_junk = true;
  pcVar7 = *current;
  while (*pcVar7 == '0') {
    pcVar7 = pcVar7 + 1;
    *current = pcVar7;
    if (pcVar7 == end) {
      *result_is_junk = false;
      if (sign) {
        return -0.0;
      }
      return 0.0;
    }
  }
  sVar2 = 0x18;
  if (read_as_double) {
    sVar2 = 0x35;
  }
  lVar11 = 0;
  while( true ) {
    iVar5 = (int)*pcVar7;
    if ((0x37 < iVar5) || (9 < iVar5 - 0x30U)) {
      if (pcVar7 != end && !allow_trailing_junk) {
        do {
          lVar13 = 0;
          while ((&kWhitespaceTable7)[lVar13] != *pcVar7) {
            lVar13 = lVar13 + 1;
            if (lVar13 == 6) {
              return junk_string_value;
            }
          }
          pcVar7 = pcVar7 + 1;
          *current = pcVar7;
        } while (pcVar7 != end);
      }
      goto LAB_00247d9f;
    }
    lVar11 = (long)iVar5 + lVar11 * 8 + -0x30;
    uVar12 = lVar11 >> sVar2;
    if ((int)uVar12 != 0) break;
    pcVar7 = pcVar7 + 1;
    *current = pcVar7;
    if (pcVar7 == end) {
LAB_00247d9f:
      *result_is_junk = false;
      if (sign) {
        if (lVar11 == 0) {
          return -0.0;
        }
        lVar11 = -lVar11;
      }
      return (double)lVar11;
    }
  }
  iVar5 = 1;
  if (1 < (int)uVar12) {
    uVar6 = uVar12 & 0xffffffff;
    do {
      iVar5 = iVar5 + 1;
      uVar6 = uVar6 >> 1;
      uVar9 = (uint)uVar12;
      uVar12 = uVar6;
    } while (3 < uVar9);
  }
  bVar4 = (byte)iVar5;
  uVar12 = lVar11 >> (bVar4 & 0x3f);
  pcVar7 = pcVar7 + 1;
  *current = pcVar7;
  bVar8 = 1;
  do {
    if (pcVar7 == end) {
LAB_00247e61:
      uVar10 = (uint)lVar11 & ~(-1 << (bVar4 & 0x1f));
      uVar9 = 1 << (bVar4 - 1 & 0x1f);
      if ((int)uVar9 < (int)uVar10) {
        uVar12 = uVar12 + 1;
      }
      else if (uVar10 == uVar9) {
        uVar12 = uVar12 + ((byte)(~bVar8 | (byte)uVar12) & 1);
      }
      bVar14 = (uVar12 >> sVar2 & 1) != 0;
      diy_fp._8_8_ = (Double *)((long)uVar12 >> bVar14);
      *result_is_junk = false;
      diy_fp.f_ = (ulong)(iVar5 + (uint)bVar14);
      dVar3 = (double)Double::DiyFpToUint64(diy_fp._8_8_,diy_fp);
      return dVar3;
    }
    cVar1 = *pcVar7;
    if ((0x37 < cVar1) || (9 < (int)cVar1 - 0x30U)) {
      if (!allow_trailing_junk) {
        do {
          lVar13 = 0;
          while ((&kWhitespaceTable7)[lVar13] != *pcVar7) {
            lVar13 = lVar13 + 1;
            if (lVar13 == 6) {
              return junk_string_value;
            }
          }
          pcVar7 = pcVar7 + 1;
          *current = pcVar7;
        } while (pcVar7 != end);
      }
      goto LAB_00247e61;
    }
    bVar8 = bVar8 & cVar1 == '0';
    iVar5 = iVar5 + 3;
    pcVar7 = pcVar7 + 1;
    *current = pcVar7;
  } while( true );
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  ASSERT(*current != end);

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  // Skip leading 0s.
  while (**current == '0') {
    ++(*current);
    if (*current == end) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);

  do {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent = overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        ++(*current);
        if (*current == end || !isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        exponent += radix_log_2;
      }

      if (!allow_trailing_junk && AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    ++(*current);
  } while (*current != end);

  ASSERT(number < ((int64_t)1 << kSignificandSize));
  ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (exponent == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  ASSERT(number != 0);
  return Double(DiyFp(number, exponent)).value();
}